

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

RESULT_TYPE_conflict2 __thiscall
duckdb::Interpolator<true>::InterpolateInternal<long,duckdb::QuantileDirect<long>>
          (Interpolator<true> *this,long *v_t,QuantileDirect<long> *accessor)

{
  INPUT_TYPE_conflict2 *pIVar1;
  QuantileDirect<long> *in_RDX;
  long in_RSI;
  byte *in_RDI;
  long *unaff_retaddr;
  long *in_stack_00000008;
  long *in_stack_00000010;
  QuantileCompare<duckdb::QuantileDirect<long>_> in_stack_00000020;
  QuantileCompare<duckdb::QuantileDirect<long>_> comp;
  QuantileCompare<duckdb::QuantileDirect<long>_> local_30;
  QuantileDirect<long> *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  QuantileCompare<duckdb::QuantileDirect<long>_>::QuantileCompare
            (&local_30,in_RDX,(bool)(*in_RDI & 1));
  ::std::nth_element<long*,duckdb::QuantileCompare<duckdb::QuantileDirect<long>>>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_00000020);
  pIVar1 = QuantileDirect<long>::operator()
                     (local_18,(INPUT_TYPE_conflict2 *)(local_10 + *(long *)(in_RDI + 8) * 8));
  return *pIVar1;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}